

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O1

bool picojson::
     _parse_codepoint<std::__cxx11::string,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *out,
               input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *in)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  FILE *__stream;
  char cVar5;
  int iVar6;
  
  uVar4 = 0;
  iVar6 = 4;
  __stream = (FILE *)in;
  do {
    iVar1 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::getc(in,__stream);
    if (iVar1 == -1) {
LAB_00108a32:
      uVar4 = 0xffffffff;
      break;
    }
    uVar2 = iVar1 - 0x30;
    if (9 < uVar2) {
      if (iVar1 - 0x41U < 6) {
        uVar2 = iVar1 - 0x37;
      }
      else {
        if (5 < iVar1 - 0x61U) {
          in->consumed_ = false;
          goto LAB_00108a32;
        }
        uVar2 = iVar1 - 0x57;
      }
    }
    uVar4 = uVar4 * 0x10 + uVar2;
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  if (uVar4 != 0xffffffff) {
    if ((uVar4 & 0xfffff800) != 0xd800) {
LAB_00108af4:
      cVar5 = (char)out;
      if (0x7f < (int)uVar4) {
        if (0x7ff < (int)uVar4) {
          if (0xffff < (int)uVar4) {
            std::__cxx11::string::push_back(cVar5);
          }
          std::__cxx11::string::push_back(cVar5);
        }
        std::__cxx11::string::push_back(cVar5);
      }
      std::__cxx11::string::push_back(cVar5);
      return true;
    }
    if ((int)uVar4 < 0xdc00) {
      iVar6 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::getc(in,__stream);
      if ((iVar6 == 0x5c) &&
         (iVar6 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::getc(in,__stream), iVar6 == 0x75)) {
        uVar2 = 0;
        iVar6 = 4;
        do {
          iVar1 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::getc(in,__stream);
          if (iVar1 == -1) {
LAB_00108ac7:
            uVar2 = 0xffffffff;
            break;
          }
          uVar3 = iVar1 - 0x30;
          if (9 < uVar3) {
            if (iVar1 - 0x41U < 6) {
              uVar3 = iVar1 - 0x37;
            }
            else {
              if (5 < iVar1 - 0x61U) {
                in->consumed_ = false;
                goto LAB_00108ac7;
              }
              uVar3 = iVar1 - 0x57;
            }
          }
          uVar2 = uVar2 * 0x10 + uVar3;
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
        uVar4 = uVar4 * 0x400 + (uVar2 & 0x3ff) + 0xfca10000;
        if ((uVar2 & 0xfffffc00) == 0xdc00) goto LAB_00108af4;
      }
      else {
        in->consumed_ = false;
      }
    }
  }
  return false;
}

Assistant:

inline bool _parse_codepoint(String &out, input<Iter> &in) {
  int uni_ch;
  if ((uni_ch = _parse_quadhex(in)) == -1) {
    return false;
  }
  if (0xd800 <= uni_ch && uni_ch <= 0xdfff) {
    if (0xdc00 <= uni_ch) {
      // a second 16-bit of a surrogate pair appeared
      return false;
    }
    // first 16-bit of surrogate pair, get the next one
    if (in.getc() != '\\' || in.getc() != 'u') {
      in.ungetc();
      return false;
    }
    int second = _parse_quadhex(in);
    if (!(0xdc00 <= second && second <= 0xdfff)) {
      return false;
    }
    uni_ch = ((uni_ch - 0xd800) << 10) | ((second - 0xdc00) & 0x3ff);
    uni_ch += 0x10000;
  }
  if (uni_ch < 0x80) {
    out.push_back(static_cast<char>(uni_ch));
  } else {
    if (uni_ch < 0x800) {
      out.push_back(static_cast<char>(0xc0 | (uni_ch >> 6)));
    } else {
      if (uni_ch < 0x10000) {
        out.push_back(static_cast<char>(0xe0 | (uni_ch >> 12)));
      } else {
        out.push_back(static_cast<char>(0xf0 | (uni_ch >> 18)));
        out.push_back(static_cast<char>(0x80 | ((uni_ch >> 12) & 0x3f)));
      }
      out.push_back(static_cast<char>(0x80 | ((uni_ch >> 6) & 0x3f)));
    }
    out.push_back(static_cast<char>(0x80 | (uni_ch & 0x3f)));
  }
  return true;
}